

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O0

void Pln_ManPrintFinal(Pln_Man_t *p,int fVerbose,int fVeryVerbose)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *p_00;
  int *__base;
  Vec_Int_t *pVVar7;
  int local_5c;
  Vec_Int_t *vPairs;
  int local_30;
  int iConst;
  int iMono;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vArray;
  int fVeryVerbose_local;
  int fVerbose_local;
  Pln_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  for (local_30 = 0; iVar2 = Vec_IntSize(p->vCoefs), local_30 < iVar2; local_30 = local_30 + 1) {
    iVar2 = Vec_IntEntry(p->vCoefs,local_30);
    if (iVar2 != 0) {
      pVVar7 = Hsh_VecReadEntry(p->pHashC,iVar2);
      iVar3 = Vec_IntEntry(pVVar7,0);
      Vec_IntPush(p_00,iVar3);
      pVVar7 = Hsh_VecReadEntry(p->pHashM,local_30);
      iVar3 = Vec_IntSize(pVVar7);
      if (iVar3 == 0) {
        local_5c = 0;
      }
      else {
        local_5c = Vec_IntEntry(pVVar7,0);
      }
      Vec_IntPush(p_00,local_5c);
      Vec_IntPushTwo(p_00,iVar2,local_30);
    }
  }
  __base = Vec_IntArray(p_00);
  iVar2 = Vec_IntSize(p_00);
  qsort(__base,(long)(iVar2 / 4),0x10,Pln_ManCompare3);
  if (fVerbose != 0) {
    for (Entry = 0; iVar2 = Vec_IntSize(p_00), Entry + 1 < iVar2; Entry = Entry + 2) {
      iVar2 = Vec_IntEntry(p_00,Entry);
      iVar3 = Vec_IntEntry(p_00,Entry + 1);
      if (Entry % 4 != 0) {
        printf("%-6d : ",(long)Entry / 4 & 0xffffffff,(long)Entry % 4 & 0xffffffff);
        pVVar7 = Hsh_VecReadEntry(p->pHashC,iVar2);
        for (iMono = 0; iVar2 = Vec_IntSize(pVVar7), iMono < iVar2; iMono = iMono + 1) {
          iVar2 = Vec_IntEntry(pVVar7,iMono);
          pcVar1 = "3jF j3&F Tj#3F &3sF 3(#F &3+F 3BF#( +a&3F 3F.#( +8&3F #(F.B3 8a&+3F 3FK#( +";
          if (iVar2 < 0) {
            pcVar1 = "R,D tc;-R R5t* -Rt> t5*RD c>Rt- t;R,M t-RM; t;V,R V-tR; t5*lR l-t>R t5VR* -";
          }
          iVar2 = Abc_AbsInt(iVar2);
          printf("%s%d",pcVar1 + 0x4a,(ulong)(uint)(1 << ((char)iVar2 - 1U & 0x1f)));
        }
        pVVar7 = Hsh_VecReadEntry(p->pHashM,iVar3);
        for (iMono = 0; iVar2 = Vec_IntSize(pVVar7), iMono < iVar2; iMono = iMono + 1) {
          uVar4 = Vec_IntEntry(pVVar7,iMono);
          printf(" * %d",(ulong)uVar4);
        }
        printf("\n");
      }
    }
  }
  uVar5 = Hsh_VecSize(p->pHashC);
  uVar6 = Hsh_VecSize(p->pHashM);
  uVar4 = p->nBuilds;
  iVar2 = Vec_IntSize(p_00);
  printf("HashC = %d. HashM = %d.  Total = %d. Used = %d.  ",(ulong)uVar5,(ulong)uVar6,(ulong)uVar4,
         (long)iVar2 / 4 & 0xffffffff);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Pln_ManPrintFinal( Pln_Man_t * p, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vArray;
    int i, k, Entry, iMono, iConst;
    // collect triples
    Vec_Int_t * vPairs = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( p->vCoefs, iConst, iMono )
    {
        if ( iConst == 0 ) 
            continue;
        vArray = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntPush( vPairs, Vec_IntEntry(vArray, 0) );
        vArray = Hsh_VecReadEntry( p->pHashM, iMono );
        Vec_IntPush( vPairs, Vec_IntSize(vArray) ? Vec_IntEntry(vArray, 0) : 0 );
        Vec_IntPushTwo( vPairs, iConst, iMono );
    }
    // sort triples
    qsort( Vec_IntArray(vPairs), (size_t)(Vec_IntSize(vPairs)/4), 16, (int (*)(const void *, const void *))Pln_ManCompare3 );
    // print
    if ( fVerbose )
    Vec_IntForEachEntryDouble( vPairs, iConst, iMono, i )
    {
        if ( i % 4 == 0 )
            continue;
        printf( "%-6d : ", i/4 );
        vArray = Hsh_VecReadEntry( p->pHashC, iConst );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( "%s%d", Entry < 0 ? "-" : "+", (1 << (Abc_AbsInt(Entry)-1)) );
        vArray = Hsh_VecReadEntry( p->pHashM, iMono );
        Vec_IntForEachEntry( vArray, Entry, k )
            printf( " * %d", Entry );
        printf( "\n" );
    }
    printf( "HashC = %d. HashM = %d.  Total = %d. Used = %d.  ", Hsh_VecSize(p->pHashC), Hsh_VecSize(p->pHashM), p->nBuilds, Vec_IntSize(vPairs)/4 );
    Vec_IntFree( vPairs );
}